

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O2

AMQP_VALUE amqpvalue_create_string(char *value)

{
  size_t sVar1;
  LOGGER_LOG p_Var2;
  AMQP_VALUE_DATA *pAVar3;
  void *__dest;
  int iVar4;
  char *pcVar5;
  
  if (value == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (AMQP_VALUE)0x0;
    }
    pcVar5 = "NULL argument value";
    iVar4 = 0x42b;
  }
  else {
    sVar1 = strlen(value);
    sVar1 = sVar1 + 1;
    if (sVar1 == 0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                  ,"amqpvalue_create_string",0x437,1,"Invalid string size exceeded max allocation");
      }
    }
    else {
      pAVar3 = REFCOUNT_AMQP_VALUE_DATA_Create();
      if (pAVar3 != (AMQP_VALUE_DATA *)0x0) {
        pAVar3->type = AMQP_TYPE_STRING;
        __dest = malloc(sVar1);
        (pAVar3->value).binary_value.bytes = __dest;
        if (__dest == (void *)0x0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                      ,"amqpvalue_create_string",1099,1,
                      "Could not allocate memory for string AMQP value");
          }
          free((void *)((long)&pAVar3[-1].value + 8));
          return (AMQP_VALUE)0x0;
        }
        memcpy(__dest,value,sVar1);
        return pAVar3;
      }
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (AMQP_VALUE)0x0;
    }
    pcVar5 = "Could not allocate memory for AMQP value";
    iVar4 = 0x442;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
            ,"amqpvalue_create_string",iVar4,1,pcVar5);
  return (AMQP_VALUE)0x0;
}

Assistant:

AMQP_VALUE amqpvalue_create_string(const char* value)
{
    AMQP_VALUE result;
    if (value == NULL)
    {
        LogError("NULL argument value");
        result = NULL;
    }
    else
    {
        size_t length = strlen(value);
        size_t malloc_size = length + 1;

        // If the result of malloc_size is zero it means it had a type overflow (size_t is an unsigned type).
        // It is very unlikely but could happen.
        if (malloc_size == 0)
        {
            LogError("Invalid string size exceeded max allocation");
            result = NULL;
        }
        else
        {
            result = REFCOUNT_TYPE_CREATE(AMQP_VALUE_DATA);
        }

        if (result == NULL)
        {
            /* Codes_SRS_AMQPVALUE_01_136: [If allocating the AMQP_VALUE fails then amqpvalue_create_string shall return NULL.] */
            LogError("Could not allocate memory for AMQP value");
        }
        else
        {
            result->type = AMQP_TYPE_STRING;
            result->value.string_value.chars = (char*)malloc(malloc_size);
            if (result->value.string_value.chars == NULL)
            {
                /* Codes_SRS_AMQPVALUE_01_136: [If allocating the AMQP_VALUE fails then amqpvalue_create_string shall return NULL.] */
                LogError("Could not allocate memory for string AMQP value");
                REFCOUNT_TYPE_DESTROY(AMQP_VALUE_DATA, result);
                result = NULL;
            }
            else
            {
                (void)memcpy(result->value.string_value.chars, value, malloc_size);
            }
        }
    }

    return result;
}